

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize_expr.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pAVar2;
  bool bVar3;
  uint64_t ref;
  ostream *poVar4;
  uint uVar5;
  pointer pAVar6;
  _Alloc_hider _Var7;
  pointer pAVar8;
  initializer_list<nivalis::Expr::ASTNode> __l;
  initializer_list<nivalis::Expr::ASTNode> __l_00;
  initializer_list<nivalis::Expr::ASTNode> __l_01;
  initializer_list<nivalis::Expr::ASTNode> __l_02;
  initializer_list<nivalis::Expr::ASTNode> __l_03;
  initializer_list<nivalis::Expr::ASTNode> __l_04;
  initializer_list<nivalis::Expr::ASTNode> __l_05;
  initializer_list<nivalis::Expr::ASTNode> __l_06;
  initializer_list<nivalis::Expr::ASTNode> __l_07;
  initializer_list<nivalis::Expr::ASTNode> __l_08;
  initializer_list<nivalis::Expr::ASTNode> __l_09;
  initializer_list<nivalis::Expr::ASTNode> __l_10;
  initializer_list<nivalis::Expr::ASTNode> __l_11;
  initializer_list<nivalis::Expr::ASTNode> __l_12;
  initializer_list<nivalis::Expr::ASTNode> __l_13;
  initializer_list<nivalis::Expr::ASTNode> __l_14;
  initializer_list<nivalis::Expr::ASTNode> __l_15;
  AST ty;
  AST ty_2;
  AST ast_one;
  AST ast_zero;
  Expr local_f8;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_d8;
  string local_c0;
  ASTNode local_a0;
  uint32_t local_90;
  anon_union_8_3_343d95dd_for_ASTNode_1 local_88;
  ASTNode local_80;
  ASTNode local_70;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_60;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_48;
  
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"x","");
  ref = nivalis::Environment::addr_of((Environment *)&(anonymous_namespace)::env,&local_c0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"nan","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"nan\", 0)",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  uVar5 = (uint)!bVar3;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2*-x*x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"2*-x*x\", 0)",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2*(x*x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"2*(x*x)\", 0)",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-(x*x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"-(x*x)\", 0)",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"0*x*1","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"0*x*1\", 0)",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"+-1*(--+--x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"+-1*(--+--x)\", 0)",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x41);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"0+1*x/1","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"0+1*x/1\", 0)",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x42);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"x+x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"x+x\", 0)",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x43);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"x-x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"x-x\", 0)",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-x+2*x-1*x-0*x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"-x+2*x-1*x-0*x\", 0)",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x45);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"x+2*x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"x+2*x\", 0)",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x46);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"9.5*-2*2*x/2*3*101","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"9.5*-2*2*x/2*3*101\", 0)",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-2*x+3*x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"-2*x+3*x\", 0)",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"3.2/(x+3)*x-3*x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"3.2/(x+3)*x-3*x\", 0)",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x49);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-29*a+3*a-5*a*x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,1,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"-29*a+3*a-5*a*x\", 1)",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-29*a+3*a-5*a","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,1,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"-29*a+3*a-5*a\", 1)",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-a^2+a^1-a^0","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,1,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"-a^2+a^1-a^0\", 1)",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"31*x^1+3*x-5e2*x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"31*x^1+3*x-5e2*x\", 0)",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-29*pi/2*x^0/2+3.5","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"-29*pi/2*x^0/2+3.5\", 0)",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-x^2*N(x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"-x^2*N(x)\", 0)",0x27);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"abs(abs(abs(x)^2))","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"abs(abs(abs(x)^2))\", 0)",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x51);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"e*x/x+x-x*x*x-x/2","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"e*x/x+x-x*x*x-x/2\", 0)",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"3^x-3^(x*x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"3^x-3^(x*x)\", 0, -10.0, 10.0)",0x36
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x53);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"e^x-e^x^0.5","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"e^x-e^x^0.5\", 0, -10.0, 10.0)",0x36
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2^x-2^(x*x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-5.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"2^x-2^(x*x)\", 0, -5.0, 10.0)",0x35)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x55);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2*exp2(x^2)-exp2(x*x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-5.0,8.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_optim_equiv_random(\"2*exp2(x^2)-exp2(x*x)\", 0, -5.0, 8.0)",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x56);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"exp(2*x)+exp(x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"exp(2*x)+exp(x)\", 0, -10.0, 100.0)"
               ,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"3*(exp(2*x)-exp(3*x))*2","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_optim_equiv_random(\"3*(exp(2*x)-exp(3*x))*2\", 0, -10.0, 100.0)",0x43);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x59);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"9*log(x^2,2)*ln(x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,1e-10,200.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "test_optim_equiv_random(\"9*log(x^2,2)*ln(x)\", 0, 1e-10, 200.0)",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"3%2%3%2%9%2%x","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"3%2%3%2%9%2%x\", 0)",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-fact(x+1)^1","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"-fact(x+1)^1\", 0)",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"{x<32.5: 9, 4}","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"{x<32.5: 9, 4}\", 0)",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"{x<32.5: x, x}","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"{x<32.5: x, x}\", 0)",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"{1: x, x^2}","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"{1: x, x^2}\", 0)",0x29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"{0: x, 2*x^2}","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"{0: x, 2*x^2}\", 0)",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"{x<3: {x<4:3}, {x<4:3}}","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"{x<3: {x<4:3}, {x<4:3}}\", 0)",0x35)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x61);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"{x<0: {x<=3: 5}, 4}","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"{x<0: {x<=3: 5}, 4}\", 0)",0x31);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x62);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"{x<0: abs(x)}","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"{x<0: abs(x)}\", 0)",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"max(x,min(x^2,x))","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"max(x,min(x^2,x))\", 0)",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sum(x=0,a)[a*x^2]","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"sum(x=0,a)[a*x^2]\", 0)",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x65);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"prod(x=1,3)[a*x^2]","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"prod(x=1,3)[a*x^2]\", 0)",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x66);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"prod(x=1,3)[{x<2:a*x^2,3}]","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"prod(x=1,3)[{x<2:a*x^2,3}]\", 0)",
               0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x67);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"10*(sin(x)^2 + cos(x)^2)","")
  ;
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"10*(sin(x)^2 + cos(x)^2)\", 0)",0x36
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x69);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"1/(2/x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"1/(2/x)\", 0)",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"3+1/(1/x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-100.0,100.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"3+1/(1/x)\", 0)",0x27);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"exp(log(x))","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,1e-10,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"exp(log(x))\", 0, 1e-10, 10)",0x34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2*pi^(ln(x))","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,1e-10,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"2*pi^(ln(x))\", 0, 1e-10, 10)",0x35)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"log2(exp2(x))","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"log2(exp2(x))\", 0, -10, 10)",0x34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"log2(x^a)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"log2(x^a)\", 0, -10, 10)",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"exp(ln(abs(x)))","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"exp(ln(abs(x)))\", 0, -10, 10)",0x36
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"3^(log(x,3))","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"3^(log(x,3))\", 0, -10., 10)",0x34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x71);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"exp(log(2^x))","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"exp(log(2^x))\", 0, -10., 10)",0x35)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x72);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2*2^(1+x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"2*2^(1+x)\", 0, -10., 10)",0x31);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x73);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2*exp2(1+2*x)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"2*exp2(1+2*x)\", 0, -10., 10)",0x35)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2^(diff(x)x^2)","");
  bVar3 = anon_unknown.dwarf_4c24::test_optim_equiv_random(&local_c0,0,-10.0,10.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optim_equiv_random(\"2^(diff(x)x^2)\", 0, -10., 10)",0x36
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" (",3);
    poVar4 = std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x75);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,0.0);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_48,__l,(allocator_type *)&local_60);
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,1.0);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_60,__l_00,(allocator_type *)&local_d8);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"x+x","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,mul);
  paVar1 = &local_c0.field_2;
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)paVar1,2.0);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_a0.opcode = local_70.opcode;
  local_a0.field_1 = local_70.field_1;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_01,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_0010792e;
    }
  }
  else {
LAB_0010792e:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"x+x\").ast",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({mul, 2., Ref(x)})",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"exp(x)+3*exp(x)","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,mul);
  paVar1 = &local_c0.field_2;
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)paVar1,4.0);
  nivalis::Expr::ASTNode::ASTNode(&local_a0,expb);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_90 = local_70.opcode;
  local_88 = local_70.field_1;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_02,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00107b88;
    }
  }
  else {
LAB_00107b88:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"exp(x)+3*exp(x)\").ast",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({mul, 4., expb, Ref(x)})",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2*x-x","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_f8,2,ref);
  local_70.opcode =
       (uint32_t)
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_70.field_1.ref =
       (uint64_t)
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  __l_03._M_len = 1;
  __l_03._M_array = &local_70;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)&local_c0,
             __l_03,(allocator_type *)&local_f8);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      local_c0._M_string_length - (long)local_c0._M_dataplus._M_p) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    _Var7._M_p = local_c0._M_dataplus._M_p;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,(ASTNode *)_Var7._M_p);
        pAVar6 = pAVar6 + 1;
        _Var7._M_p = _Var7._M_p + 0x10;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00107daa;
    }
  }
  else {
LAB_00107daa:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"2*x-x\").ast",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AST({Ref(x)})",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if ((ASTNode *)local_c0._M_dataplus._M_p != (ASTNode *)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) -
                    (long)local_c0._M_dataplus._M_p);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"3*x^2-2*x^2-x^2","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)&local_c0,
             &local_48);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      local_c0._M_string_length - (long)local_c0._M_dataplus._M_p) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    _Var7._M_p = local_c0._M_dataplus._M_p;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,(ASTNode *)_Var7._M_p);
        pAVar6 = pAVar6 + 1;
        _Var7._M_p = _Var7._M_p + 0x10;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00107fab;
    }
  }
  else {
LAB_00107fab:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"3*x^2-2*x^2-x^2\").ast",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ast_zero",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if ((ASTNode *)local_c0._M_dataplus._M_p != (ASTNode *)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) -
                    (long)local_c0._M_dataplus._M_p);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"x*-3*x*x*2*x","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,mul);
  paVar1 = &local_c0.field_2;
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)paVar1,-6.0);
  nivalis::Expr::ASTNode::ASTNode(&local_a0,power);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_90 = local_70.opcode;
  local_88 = local_70.field_1;
  nivalis::Expr::ASTNode::ASTNode(&local_80,4.0);
  __l_04._M_len = 5;
  __l_04._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_04,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00108223;
    }
  }
  else {
LAB_00108223:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"x*-3*x*x*2*x\").ast",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({mul, -6., power, Ref(x), 4.})",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"sin(x)*sin(x) + cos(x)*cos(x)","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)&local_c0,
             &local_60);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      local_c0._M_string_length - (long)local_c0._M_dataplus._M_p) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    _Var7._M_p = local_c0._M_dataplus._M_p;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,(ASTNode *)_Var7._M_p);
        pAVar6 = pAVar6 + 1;
        _Var7._M_p = _Var7._M_p + 0x10;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00108421;
    }
  }
  else {
LAB_00108421:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"sin(x)*sin(x) + cos(x)*cos(x)\").ast",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ast_one",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if ((ASTNode *)local_c0._M_dataplus._M_p != (ASTNode *)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) -
                    (long)local_c0._M_dataplus._M_p);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"---x","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,unaryminus);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_c0.field_2._M_allocated_capacity._0_4_ = local_70.opcode;
  local_c0.field_2._8_8_ = local_70.field_1;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_05,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_0010865a;
    }
  }
  else {
LAB_0010865a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"---x\").ast",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({unaryminus, Ref(x)})",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"----x^2","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,sqrb);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_c0.field_2._M_allocated_capacity._0_4_ = local_70.opcode;
  local_c0.field_2._8_8_ = local_70.field_1;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_06,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00108890;
    }
  }
  else {
LAB_00108890:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"----x^2\").ast",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({sqrb, Ref(x)})",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x81);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"3*3/4*x/3*4","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,mul);
  paVar1 = &local_c0.field_2;
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)paVar1,3.0);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_a0.opcode = local_70.opcode;
  local_a0.field_1 = local_70.field_1;
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_07,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00108adb;
    }
  }
  else {
LAB_00108adb:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"3*3/4*x/3*4\").ast",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({mul, 3., Ref(x)})",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x82);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"x^2/x","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_f8,2,ref);
  local_70.opcode =
       (uint32_t)
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_70.field_1.ref =
       (uint64_t)
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  __l_08._M_len = 1;
  __l_08._M_array = &local_70;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)&local_c0,
             __l_08,(allocator_type *)&local_f8);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      local_c0._M_string_length - (long)local_c0._M_dataplus._M_p) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    _Var7._M_p = local_c0._M_dataplus._M_p;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,(ASTNode *)_Var7._M_p);
        pAVar6 = pAVar6 + 1;
        _Var7._M_p = _Var7._M_p + 0x10;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00108cfd;
    }
  }
  else {
LAB_00108cfd:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"x^2/x\").ast",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AST({Ref(x)})",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                *)&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x83);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if ((ASTNode *)local_c0._M_dataplus._M_p != (ASTNode *)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) -
                    (long)local_c0._M_dataplus._M_p);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"x^1.5*x^0.2","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,power);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_c0.field_2._M_allocated_capacity._0_4_ = local_70.opcode;
  local_c0.field_2._8_8_ = local_70.field_1;
  nivalis::Expr::ASTNode::ASTNode(&local_a0,1.7);
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_09,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00108f51;
    }
  }
  else {
LAB_00108f51:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"x^1.5*x^0.2\").ast",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({power, Ref(x), 1.7})",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"2^x","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,exp2b);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_c0.field_2._M_allocated_capacity._0_4_ = local_70.opcode;
  local_c0.field_2._8_8_ = local_70.field_1;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_10,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00109187;
    }
  }
  else {
LAB_00109187:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"2^x\").ast",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({exp2b, Ref(x)})",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x85);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"log(x,10)","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,log10b);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_c0.field_2._M_allocated_capacity._0_4_ = local_70.opcode;
  local_c0.field_2._8_8_ = local_70.field_1;
  __l_11._M_len = 2;
  __l_11._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_11,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_001093bd;
    }
  }
  else {
LAB_001093bd:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"log(x,10)\").ast",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({log10b, Ref(x)})",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x86);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"exp(x)*exp(2*x)","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,expb);
  paVar1 = &local_c0.field_2;
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)paVar1,mul);
  nivalis::Expr::ASTNode::ASTNode(&local_a0,3.0);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_90 = local_70.opcode;
  local_88 = local_70.field_1;
  __l_12._M_len = 4;
  __l_12._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_12,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00109617;
    }
  }
  else {
LAB_00109617:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"exp(x)*exp(2*x)\").ast",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({expb, mul, 3., Ref(x)})",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x87);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"exp(x)/exp(2*x)","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,expb);
  paVar1 = &local_c0.field_2;
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)paVar1,unaryminus);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_a0.opcode = local_70.opcode;
  local_a0.field_1 = local_70.field_1;
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_13,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_0010985f;
    }
  }
  else {
LAB_0010985f:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"exp(x)/exp(2*x)\").ast",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({expb, unaryminus, Ref(x)})",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"exp(log(2^x))","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,exp2b);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_c0.field_2._M_allocated_capacity._0_4_ = local_70.opcode;
  local_c0.field_2._8_8_ = local_70.field_1;
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_14,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
        pAVar6 = pAVar6 + 1;
        pAVar8 = pAVar8 + 1;
      } while (bVar3 && pAVar6 != pAVar2);
      if (!bVar3) goto LAB_00109a95;
    }
  }
  else {
LAB_00109a95:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"optim(\"exp(log(2^x))\").ast",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"AST({exp2b, Ref(x)})",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar4 = operator<<((ostream *)&std::cout,&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
    poVar4 = operator<<(poVar4,&local_f8.ast);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x89);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar5 = uVar5 + 1;
  }
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"log(exp(sgn(x)))","");
  anon_unknown.dwarf_4c24::optim(&local_f8,&local_c0);
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (ASTNode *)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                             local_c0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  nivalis::Expr::ASTNode::ASTNode((ASTNode *)&local_c0,sgn);
  nivalis::Expr::ASTNode::ASTNode(&local_70,2,ref);
  local_c0.field_2._M_allocated_capacity._0_4_ = local_70.opcode;
  local_c0.field_2._8_8_ = local_70.field_1;
  __l_15._M_len = 2;
  __l_15._M_array = (iterator)&local_c0;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_f8.ast,__l_15,(allocator_type *)&local_70);
  pAVar2 = local_d8.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pAVar6 = local_d8.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar8 = local_f8.ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00109dd8;
    do {
      bVar3 = nivalis::Expr::ASTNode::operator==(pAVar6,pAVar8);
      pAVar6 = pAVar6 + 1;
      pAVar8 = pAVar8 + 1;
    } while (bVar3 && pAVar6 != pAVar2);
    if (bVar3) goto LAB_00109dd8;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Assertion FAILED: ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"optim(\"log(exp(sgn(x)))\").ast",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"AST({sgn, Ref(x)})",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
  poVar4 = operator<<((ostream *)&std::cout,&local_d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
  poVar4 = operator<<(poVar4,&local_f8.ast);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n  at ",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"test_optimize_expr",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," line ",6);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  uVar5 = uVar5 + 1;
LAB_00109dd8:
  if (local_f8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_f8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (ASTNode *)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (uVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": all passed\n",0xd);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_optimize_expr",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," asserts FAILED\n",0x10);
  }
  if (local_60.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (uint)(uVar5 != 0);
}

Assistant:

int main() {
    BEGIN_TEST(test_optimize_expr);

    auto x = env.addr_of("x", false);

    // Correctness
    ASSERT(test_optim_equiv_random("nan", 0));

    ASSERT(test_optim_equiv_random("2*-x*x", 0));
    ASSERT(test_optim_equiv_random("2*(x*x)", 0));
    ASSERT(test_optim_equiv_random("-(x*x)", 0));
    ASSERT(test_optim_equiv_random("0*x*1", 0));
    ASSERT(test_optim_equiv_random("+-1*(--+--x)", 0));
    ASSERT(test_optim_equiv_random("0+1*x/1", 0));
    ASSERT(test_optim_equiv_random("x+x", 0));
    ASSERT(test_optim_equiv_random("x-x", 0));
    ASSERT(test_optim_equiv_random("-x+2*x-1*x-0*x", 0));
    ASSERT(test_optim_equiv_random("x+2*x", 0));
    ASSERT(test_optim_equiv_random("9.5*-2*2*x/2*3*101", 0));
    ASSERT(test_optim_equiv_random("-2*x+3*x", 0));
    ASSERT(test_optim_equiv_random("3.2/(x+3)*x-3*x", 0));

    ASSERT(test_optim_equiv_random("-29*a+3*a-5*a*x", 1));
    ASSERT(test_optim_equiv_random("-29*a+3*a-5*a", 1));
    ASSERT(test_optim_equiv_random("-a^2+a^1-a^0", 1));
    ASSERT(test_optim_equiv_random("31*x^1+3*x-5e2*x", 0));
    ASSERT(test_optim_equiv_random("-29*pi/2*x^0/2+3.5", 0));
    ASSERT(test_optim_equiv_random("-x^2*N(x)", 0));
    ASSERT(test_optim_equiv_random("abs(abs(abs(x)^2))", 0));
    ASSERT(test_optim_equiv_random("e*x/x+x-x*x*x-x/2", 0));
    ASSERT(test_optim_equiv_random("3^x-3^(x*x)", 0, -10.0, 10.0));
    ASSERT(test_optim_equiv_random("e^x-e^x^0.5", 0, -10.0, 10.0));
    ASSERT(test_optim_equiv_random("2^x-2^(x*x)", 0, -5.0, 10.0));
    ASSERT(test_optim_equiv_random("2*exp2(x^2)-exp2(x*x)", 0, -5.0, 8.0));
    ASSERT(test_optim_equiv_random("exp(2*x)+exp(x)", 0, -10.0, 100.0));
    ASSERT(test_optim_equiv_random("3*(exp(2*x)-exp(3*x))*2",
                0, -10.0, 100.0));
    ASSERT(test_optim_equiv_random("9*log(x^2,2)*ln(x)", 0, 1e-10, 200.0));
    ASSERT(test_optim_equiv_random("3%2%3%2%9%2%x", 0));
    ASSERT(test_optim_equiv_random("-fact(x+1)^1", 0));
    ASSERT(test_optim_equiv_random("{x<32.5: 9, 4}", 0));
    ASSERT(test_optim_equiv_random("{x<32.5: x, x}", 0));
    ASSERT(test_optim_equiv_random("{1: x, x^2}", 0));
    ASSERT(test_optim_equiv_random("{0: x, 2*x^2}", 0));
    ASSERT(test_optim_equiv_random("{x<3: {x<4:3}, {x<4:3}}", 0));
    ASSERT(test_optim_equiv_random("{x<0: {x<=3: 5}, 4}", 0));
    ASSERT(test_optim_equiv_random("{x<0: abs(x)}", 0));
    ASSERT(test_optim_equiv_random("max(x,min(x^2,x))", 0));
    ASSERT(test_optim_equiv_random("sum(x=0,a)[a*x^2]", 0));
    ASSERT(test_optim_equiv_random("prod(x=1,3)[a*x^2]", 0));
    ASSERT(test_optim_equiv_random("prod(x=1,3)[{x<2:a*x^2,3}]", 0));

    ASSERT(test_optim_equiv_random("10*(sin(x)^2 + cos(x)^2)", 0));
    ASSERT(test_optim_equiv_random("1/(2/x)", 0));
    ASSERT(test_optim_equiv_random("3+1/(1/x)", 0));
    ASSERT(test_optim_equiv_random("exp(log(x))", 0, 1e-10, 10));
    ASSERT(test_optim_equiv_random("2*pi^(ln(x))", 0, 1e-10, 10));
    ASSERT(test_optim_equiv_random("log2(exp2(x))", 0, -10, 10));
    ASSERT(test_optim_equiv_random("log2(x^a)", 0, -10, 10));
    ASSERT(test_optim_equiv_random("exp(ln(abs(x)))", 0, -10, 10));
    ASSERT(test_optim_equiv_random("3^(log(x,3))", 0, -10., 10));
    ASSERT(test_optim_equiv_random("exp(log(2^x))", 0, -10., 10));
    ASSERT(test_optim_equiv_random("2*2^(1+x)", 0, -10., 10));
    ASSERT(test_optim_equiv_random("2*exp2(1+2*x)", 0, -10., 10));
    ASSERT(test_optim_equiv_random("2^(diff(x)x^2)", 0, -10., 10));

    using namespace OpCode;
    AST ast_zero = {0.}, ast_one = {1.};
    // Basic competence
    ASSERT_EQ(optim("x+x").ast, AST({mul, 2., Ref(x)}));
    ASSERT_EQ(optim("exp(x)+3*exp(x)").ast, AST({mul, 4., expb, Ref(x)}));
    ASSERT_EQ(optim("2*x-x").ast, AST({Ref(x)}));
    ASSERT_EQ(optim("3*x^2-2*x^2-x^2").ast, ast_zero);
    ASSERT_EQ(optim("x*-3*x*x*2*x").ast, AST({mul, -6., power, Ref(x), 4.}));
    ASSERT_EQ(optim("sin(x)*sin(x) + cos(x)*cos(x)").ast, ast_one);
    ASSERT_EQ(optim("---x").ast, AST({unaryminus, Ref(x)}));
    ASSERT_EQ(optim("----x^2").ast, AST({sqrb, Ref(x)}));
    ASSERT_EQ(optim("3*3/4*x/3*4").ast, AST({mul, 3., Ref(x)}));
    ASSERT_EQ(optim("x^2/x").ast, AST({Ref(x)}));
    ASSERT_EQ(optim("x^1.5*x^0.2").ast, AST({power, Ref(x), 1.7}));
    ASSERT_EQ(optim("2^x").ast, AST({exp2b, Ref(x)}));
    ASSERT_EQ(optim("log(x,10)").ast, AST({log10b, Ref(x)}));
    ASSERT_EQ(optim("exp(x)*exp(2*x)").ast, AST({expb, mul, 3., Ref(x)}));
    ASSERT_EQ(optim("exp(x)/exp(2*x)").ast, AST({expb, unaryminus, Ref(x)}));
    ASSERT_EQ(optim("exp(log(2^x))").ast, AST({exp2b, Ref(x)}));
    ASSERT_EQ(optim("log(exp(sgn(x)))").ast, AST({sgn, Ref(x)}));

    END_TEST;
}